

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

SourceCodeInfo * __thiscall
google::protobuf::FileDescriptorProto::_internal_mutable_source_code_info(FileDescriptorProto *this)

{
  SourceCodeInfo *pSVar1;
  Arena *arena;
  
  pSVar1 = (this->field_0)._impl_.source_code_info_;
  if (pSVar1 != (SourceCodeInfo *)0x0) {
    return pSVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pSVar1 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(arena);
  (this->field_0)._impl_.source_code_info_ = pSVar1;
  return pSVar1;
}

Assistant:

inline ::google::protobuf::SourceCodeInfo* PROTOBUF_NONNULL FileDescriptorProto::_internal_mutable_source_code_info() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.source_code_info_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::SourceCodeInfo>(GetArena());
    _impl_.source_code_info_ = reinterpret_cast<::google::protobuf::SourceCodeInfo*>(p);
  }
  return _impl_.source_code_info_;
}